

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall
font2svg::glyph::svgtransform_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  FT_Pos FVar1;
  FT_Pos FVar2;
  ostream *poVar3;
  int xadj;
  int yadj;
  allocator<char> local_39;
  string local_38 [32];
  glyph *local_18;
  glyph *this_local;
  
  local_18 = this;
  this_local = (glyph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringstream::str((string *)&this->tmp);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::operator<<((ostream *)&this->field_0x270,
                  "\n\n <!-- make sure glyph is visible within svg window -->");
  FVar1 = (this->gm).horiBearingY;
  FVar2 = (this->gm).vertBearingY;
  poVar3 = std::operator<<((ostream *)&this->field_0x270,"\n <g fill-rule=\'nonzero\' ");
  poVar3 = std::operator<<(poVar3," transform=\'translate(");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,100);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)FVar1 + (int)FVar2 + 100);
  poVar3 = std::operator<<(poVar3,")\'");
  std::operator<<(poVar3,">");
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgtransform() {
		// TrueType points are not in the range usually visible by SVG.
		// they often have negative numbers etc. So.. here we
		// 'transform' to make visible.
		//
		// note also that y coords of all points have been flipped during
		// init() so that SVG Y positive = Truetype Y positive
		tmp.str("");
		tmp << "\n\n <!-- make sure glyph is visible within svg window -->";
		int yadj = gm.horiBearingY + gm.vertBearingY + 100;
		int xadj = 100;
		tmp << "\n <g fill-rule='nonzero' "
			<< " transform='translate(" << xadj << " " << yadj << ")'"
			<< ">";
		return tmp.str();
	}